

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraResolution
          (VClient *this,string *i_rCameraName,uint *o_rResolutionX,uint *o_rResolutionY)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_34;
  unique_lock<boost::recursive_mutex> local_30;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_30,&this->m_FrameMutex);
  local_34 = Success;
  bVar2 = InitGet<unsigned_int,unsigned_int>(this,&local_34,o_rResolutionX,o_rResolutionY);
  if (bVar2) {
    pVVar3 = GetCamera(this,i_rCameraName,&local_34);
    if (pVVar3 != (VCameraInfo *)0x0) {
      *o_rResolutionX = pVVar3->m_ResolutionX;
      *o_rResolutionY = pVVar3->m_ResolutionY;
    }
  }
  EVar1 = local_34;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_30);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraResolution( const std::string & i_rCameraName, unsigned int & o_rResolutionX, unsigned int & o_rResolutionY ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rResolutionX, o_rResolutionY ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    o_rResolutionX = pCamera->m_ResolutionX;
    o_rResolutionY = pCamera->m_ResolutionY;
  }

  return GetResult;
}